

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O1

float __thiscall testgen::_bigrecord_Union__0__::get_float(_bigrecord_Union__0__ *this)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->idx_ == 2) {
    pfVar1 = boost::any_cast<float_const&>(&this->value_);
    return *pfVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Invalid type for union","");
  std::runtime_error::runtime_error((runtime_error *)(puVar2 + 1),(string *)local_40);
  *puVar2 = 0x1c87a0;
  puVar2[1] = 0x1c87d0;
  __cxa_throw(puVar2,&avro::Exception::typeinfo,avro::Exception::~Exception);
}

Assistant:

inline
float _bigrecord_Union__0__::get_float() const {
    if (idx_ != 2) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<float >(value_);
}